

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

int AF_A_SelectSigilAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  undefined8 *puVar3;
  player_t *this;
  PClass *pPVar4;
  PClass *pPVar5;
  DPSprite *this_00;
  undefined4 in_register_00000014;
  ulong uVar6;
  VMValue *pVVar7;
  char *__assertion;
  undefined8 *puVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005fb4b8;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar8 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar8 == (undefined8 *)0x0) {
LAB_005fb3a6:
        puVar8 = (undefined8 *)0x0;
        pVVar7 = param;
      }
      else {
        auVar11._8_8_ = uVar6;
        auVar11._0_8_ = puVar8[1];
        if (puVar8[1] == 0) {
          auVar11 = (**(code **)*puVar8)(puVar8);
          puVar8[1] = auVar11._0_8_;
        }
        pPVar5 = auVar11._0_8_;
        bVar9 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        uVar6 = (ulong)bVar9;
        bVar10 = pPVar5 == pPVar4;
        if (!bVar10 && !bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar4) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar10 || bVar9);
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005fb4b8;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005fb45b;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005fb4a8;
        puVar3 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar3 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar3[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar7,uVar6,ret);
              puVar3[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar4 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar4) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005fb4b8;
            }
          }
        }
        else if (puVar3 != (undefined8 *)0x0) goto LAB_005fb4a8;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005fb45b:
        this = (player_t *)puVar8[0x40];
        if (this != (player_t *)0x0) {
          iVar2 = *(int *)&this->ReadyWeapon->field_0x584;
          this_00 = player_t::GetPSprite(this,PSP_WEAPON);
          DPSprite::SetState(this_00,this_00->State + (long)iVar2 * 4 + -3,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005fb4b8;
    }
    if (puVar8 == (undefined8 *)0x0) goto LAB_005fb3a6;
  }
LAB_005fb4a8:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005fb4b8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x38a,"int AF_A_SelectSigilAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SelectSigilAttack)
{
	PARAM_ACTION_PROLOGUE;

	DPSprite *pspr;
	int pieces;

	if (self->player == nullptr)
	{
		return 0;
	}
	pieces = static_cast<ASigil*>(self->player->ReadyWeapon)->NumPieces;
	pspr = self->player->GetPSprite(PSP_WEAPON);
	pspr->SetState(pspr->GetState() + 4*pieces - 3);
	return 0;
}